

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::text::render_value(text *this,form_context *context)

{
  ostream *poVar1;
  string sStack_58;
  string local_38;
  
  if (((&(this->super_base_html_input).field_0x1f0)
       [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 2) != 0) {
    poVar1 = form_context::out(context);
    poVar1 = std::operator<<(poVar1," value=\"");
    base_text::value_abi_cxx11_(&local_38,(base_text *)&(this->super_base_html_input).field_0x30);
    util::escape(&sStack_58,&local_38);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_58);
    std::operator<<(poVar1,"\"");
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void text::render_value(form_context &context)
{
	if(set()) {
		context.out() << " value=\"" << util::escape(value()) << "\"";
	}
}